

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::CompositeExtractFeedingConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this;
  uint uVar1;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvVar2;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Operand *local_170;
  allocator<spvtools::opt::Operand> local_151;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_150;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_148;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_140;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_138;
  OperandList local_130;
  allocator<spvtools::opt::Operand> local_115;
  uint32_t local_114;
  iterator local_110;
  undefined8 local_108;
  SmallVector<unsigned_int,_2UL> local_100;
  Operand local_d8;
  iterator local_a8;
  _func_int **local_a0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_98;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_80;
  Operand *local_78;
  __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
  local_70;
  iterator local_68;
  uint32_t local_5c;
  Instruction *pIStack_58;
  uint32_t original_type_id;
  Instruction *original_inst;
  Instruction *element_inst;
  uint32_t element_id;
  uint32_t i;
  Instruction *first_element_inst;
  DefUseManager *pDStack_30;
  uint32_t original_id;
  DefUseManager *def_use_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *context_local;
  
  def_use_mgr = (DefUseManager *)param_3;
  param_2_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  OVar4 = opt::Instruction::opcode(inst);
  if (OVar4 != OpCompositeConstruct) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeConstruct && \"Wrong opcode.  Should be OpCompositeConstruct.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6da,
                  "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  pDStack_30 = IRContext::get_def_use_mgr((IRContext *)inst_local);
  first_element_inst._4_4_ = 0;
  uVar5 = opt::Instruction::NumInOperands((Instruction *)param_2_local);
  if (uVar5 == 0) {
    context_local._7_1_ = false;
  }
  else {
    _element_id = (Instruction *)0x0;
    for (element_inst._4_4_ = 0; uVar1 = element_inst._4_4_,
        uVar5 = opt::Instruction::NumInOperands((Instruction *)param_2_local), uVar1 < uVar5;
        element_inst._4_4_ = element_inst._4_4_ + 1) {
      element_inst._0_4_ =
           opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,element_inst._4_4_)
      ;
      original_inst = analysis::DefUseManager::GetDef(pDStack_30,(uint32_t)element_inst);
      if (_element_id == (Instruction *)0x0) {
        _element_id = original_inst;
      }
      OVar4 = opt::Instruction::opcode(original_inst);
      if (OVar4 != OpCompositeExtract) {
        return false;
      }
      bVar3 = HaveSameIndexesExceptForLast(original_inst,_element_id);
      this = original_inst;
      if (!bVar3) {
        return false;
      }
      uVar5 = opt::Instruction::NumInOperands(original_inst);
      uVar6 = opt::Instruction::GetSingleWordInOperand(this,uVar5 - 1);
      uVar5 = first_element_inst._4_4_;
      if (uVar6 != element_inst._4_4_) {
        return false;
      }
      if (element_inst._4_4_ == 0) {
        first_element_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(original_inst,0);
      }
      else {
        uVar6 = opt::Instruction::GetSingleWordInOperand(original_inst,0);
        if (uVar5 != uVar6) {
          return false;
        }
      }
    }
    if (_element_id == (Instruction *)0x0) {
      __assert_fail("first_element_inst != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x704,
                    "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                   );
    }
    pIStack_58 = analysis::DefUseManager::GetDef(pDStack_30,first_element_inst._4_4_);
    uVar5 = opt::Instruction::type_id(pIStack_58);
    local_70._M_current = (Operand *)opt::Instruction::begin(_element_id);
    local_68._M_current =
         (Operand *)
         __gnu_cxx::
         __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
         ::operator+(&local_70,3);
    local_80._M_current = (Operand *)opt::Instruction::end(_element_id);
    local_78 = (Operand *)
               __gnu_cxx::
               __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
               ::operator-(&local_80,1);
    local_5c = GetElementType(uVar5,local_68,(iterator)local_78,pDStack_30);
    uVar5 = opt::Instruction::type_id((Instruction *)param_2_local);
    if (uVar5 == local_5c) {
      uVar5 = opt::Instruction::NumInOperands(_element_id);
      if (uVar5 == 2) {
        opt::Instruction::SetOpcode((Instruction *)param_2_local,OpCopyObject);
        pvVar2 = param_2_local;
        local_114 = first_element_inst._4_4_;
        local_110 = &local_114;
        local_108 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_110;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
        Operand::Operand(&local_d8,SPV_OPERAND_TYPE_ID,&local_100);
        local_a8 = &local_d8;
        local_a0 = (_func_int **)0x1;
        std::allocator<spvtools::opt::Operand>::allocator(&local_115);
        __l._M_len = (size_type)local_a0;
        __l._M_array = local_a8;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  (&local_98,__l,&local_115);
        opt::Instruction::SetInOperands((Instruction *)pvVar2,&local_98);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_98);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_115);
        local_170 = (Operand *)&local_a8;
        do {
          local_170 = local_170 + -1;
          Operand::~Operand(local_170);
        } while (local_170 != &local_d8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
        context_local._7_1_ = true;
      }
      else {
        opt::Instruction::SetOpcode((Instruction *)param_2_local,OpCompositeExtract);
        pvVar2 = param_2_local;
        local_140._M_current = (Operand *)opt::Instruction::begin(_element_id);
        local_138 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                    ::operator+(&local_140,2);
        local_150._M_current = (Operand *)opt::Instruction::end(_element_id);
        local_148 = __gnu_cxx::
                    __normal_iterator<spvtools::opt::Operand_*,_std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>_>
                    ::operator-(&local_150,1);
        std::allocator<spvtools::opt::Operand>::allocator(&local_151);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        vector<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>,void>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_130,local_138,local_148,&local_151);
        opt::Instruction::SetInOperands((Instruction *)pvVar2,&local_130);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_130);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_151);
        context_local._7_1_ = true;
      }
    }
    else {
      context_local._7_1_ = false;
    }
  }
  return context_local._7_1_;
}

Assistant:

bool CompositeExtractFeedingConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Wrong opcode.  Should be OpCompositeConstruct.");
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  uint32_t original_id = 0;

  if (inst->NumInOperands() == 0) {
    // The struct being constructed has no members.
    return false;
  }

  // Check each element to make sure they are:
  // - extractions
  // - extracting the same position they are inserting
  // - all extract from the same id.
  Instruction* first_element_inst = nullptr;
  for (uint32_t i = 0; i < inst->NumInOperands(); ++i) {
    const uint32_t element_id = inst->GetSingleWordInOperand(i);
    Instruction* element_inst = def_use_mgr->GetDef(element_id);
    if (first_element_inst == nullptr) {
      first_element_inst = element_inst;
    }

    if (element_inst->opcode() != spv::Op::OpCompositeExtract) {
      return false;
    }

    if (!HaveSameIndexesExceptForLast(element_inst, first_element_inst)) {
      return false;
    }

    if (element_inst->GetSingleWordInOperand(element_inst->NumInOperands() -
                                             1) != i) {
      return false;
    }

    if (i == 0) {
      original_id =
          element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    } else if (original_id !=
               element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx)) {
      return false;
    }
  }
  assert(first_element_inst != nullptr);

  // The last check it to see that the object being extracted from is the
  // correct type.
  Instruction* original_inst = def_use_mgr->GetDef(original_id);
  uint32_t original_type_id =
      GetElementType(original_inst->type_id(), first_element_inst->begin() + 3,
                     first_element_inst->end() - 1, def_use_mgr);

  if (inst->type_id() != original_type_id) {
    return false;
  }

  if (first_element_inst->NumInOperands() == 2) {
    // Simplify by using the original object.
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {original_id}}});
    return true;
  }

  // Copies the original id and all indexes except for the last to the new
  // extract instruction.
  inst->SetOpcode(spv::Op::OpCompositeExtract);
  inst->SetInOperands(std::vector<Operand>(first_element_inst->begin() + 2,
                                           first_element_inst->end() - 1));
  return true;
}